

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O0

void gflags::anon_unknown_5::Test_GetCommandLineOptionTest_NameExistsAndIsDefault::RunTest(void)

{
  bool bVar1;
  bool r;
  allocator local_29;
  string local_28 [8];
  string value;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"will be changed",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  bVar1 = GetCommandLineOption("test_bool",(string *)local_28);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","r");
    exit(1);
  }
  bVar1 = std::operator==("false",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_28);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","\"false\"","==","value");
    exit(1);
  }
  bVar1 = GetCommandLineOption("test_int32",(string *)local_28);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","r");
    exit(1);
  }
  bVar1 = std::operator==("-1",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_28);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","\"-1\"","==","value");
    exit(1);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(GetCommandLineOptionTest, NameExistsAndIsDefault) {
  string value("will be changed");
  bool r = GetCommandLineOption("test_bool", &value);
  EXPECT_TRUE(r);
  EXPECT_EQ("false", value);

  r = GetCommandLineOption("test_int32", &value);
  EXPECT_TRUE(r);
  EXPECT_EQ("-1", value);
}